

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  int lenght;
  int lenght_00;
  byte *c;
  SAttribute attr;
  string<char> s;
  SAttribute local_88;
  string<char> local_68;
  byte *local_58;
  byte *local_50;
  array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *local_48;
  IIrrXMLReader<char,_irr::io::IXMLBase> local_40;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  local_48 = &this->Attributes;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear(local_48);
  local_50 = (byte *)this->P;
  local_58 = local_50;
  while ((0x3e < (ulong)*local_58 || ((0x4000000100002600U >> ((ulong)*local_58 & 0x3f) & 1) == 0)))
  {
    local_58 = local_58 + 1;
    this->P = (char *)local_58;
  }
  do {
    while( true ) {
      pbVar5 = (byte *)this->P;
      uVar3 = (ulong)*pbVar5;
      if (uVar3 < 0x3f) break;
LAB_006bb743:
      pbVar4 = (byte *)this->P;
      lenght_00 = (int)pbVar4 - (int)pbVar5;
      c = pbVar4;
      while( true ) {
        c = c + 1;
        if (((ulong)*pbVar4 < 0x3e) && ((0x2000000100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))
        break;
        pbVar4 = pbVar4 + 1;
        this->P = (char *)pbVar4;
        lenght_00 = lenght_00 + 1;
      }
      do {
        this->P = (char *)c;
        bVar1 = *c;
        if (bVar1 == 0) {
          return;
        }
        c = c + 1;
      } while ((bVar1 != 0x27) && (bVar1 != 0x22));
      lenght = -1;
      pbVar4 = c;
      do {
        this->P = (char *)pbVar4;
        bVar2 = *pbVar4;
        pbVar4 = pbVar4 + 1;
        lenght = lenght + 1;
        if (bVar2 == bVar1) break;
      } while (bVar2 != 0);
      if (bVar2 == 0) {
        return;
      }
      this->P = (char *)pbVar4;
      local_88.Name.array = (char *)0x0;
      local_88.Name.allocated = 1;
      local_88.Name.used = 1;
      local_88.Name.array = (char *)operator_new__(1);
      *local_88.Name.array = '\0';
      local_88.Value.array = (char *)0x0;
      local_88.Value.allocated = 1;
      local_88.Value.used = 1;
      local_88.Value.array = (char *)operator_new__(1);
      *local_88.Value.array = '\0';
      core::string<char>::string<char>(&local_68,(char *)pbVar5,lenght_00);
      core::string<char>::operator=(&local_88.Name,&local_68);
      if (local_68.array != (char *)0x0) {
        operator_delete__(local_68.array);
      }
      core::string<char>::string<char>(&local_68,(char *)c,lenght);
      replaceSpecialCharacters
                ((CXMLReaderImpl<char,_irr::io::IXMLBase> *)&stack0xffffffffffffffc0,
                 (string<char> *)this);
      core::string<char>::operator=(&local_88.Value,(string<char> *)&stack0xffffffffffffffc0);
      if (local_40._vptr_IIrrXMLReader != (_func_int **)0x0) {
        operator_delete__(local_40._vptr_IIrrXMLReader);
      }
      core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::push_back
                (local_48,&local_88);
      if (local_68.array != (char *)0x0) {
        operator_delete__(local_68.array);
      }
      if (local_88.Value.array != (char *)0x0) {
        operator_delete__(local_88.Value.array);
      }
      if (local_88.Name.array != (char *)0x0) {
        operator_delete__(local_88.Name.array);
      }
    }
    if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
      if (uVar3 == 0x2f) {
        this->P = (char *)(pbVar5 + 1);
        this->IsEmptyElement = true;
LAB_006bb8c3:
        pbVar5 = local_58;
        if ((local_50 < local_58) && (local_58[-1] == 0x2f)) {
          pbVar5 = local_58 + -1;
          this->IsEmptyElement = true;
        }
        core::string<char>::string<char>
                  (&local_88.Name,(char *)local_50,(int)pbVar5 - (int)local_50);
        core::string<char>::operator=(&this->NodeName,&local_88.Name);
        if (local_88.Name.array != (char *)0x0) {
          operator_delete__(local_88.Name.array);
        }
        this->P = this->P + 1;
        return;
      }
      if (uVar3 == 0x3e) goto LAB_006bb8c3;
      goto LAB_006bb743;
    }
    this->P = (char *)(pbVar5 + 1);
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}